

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callable_traits.hpp
# Opt level: O0

Boxed_Number __thiscall
chaiscript::dispatch::detail::
Fun_Caller<chaiscript::Boxed_Number,chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&>::
operator()(Fun_Caller<chaiscript::Boxed_Number,_chaiscript::Boxed_Number,_const_chaiscript::Boxed_Number_&>
           *this,Boxed_Number *inner,Boxed_Number *inner_1)

{
  code *pcVar1;
  undefined8 in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  element_type *in_RDI;
  Boxed_Number BVar2;
  Boxed_Number *in_stack_ffffffffffffff98;
  element_type *peVar3;
  undefined1 local_30 [16];
  undefined8 local_20;
  
  pcVar1 = (code *)*in_RSI;
  peVar3 = in_RDI;
  local_20 = in_RCX;
  Boxed_Number::Boxed_Number((Boxed_Number *)in_RDI,in_stack_ffffffffffffff98);
  (*pcVar1)(in_RDI,local_30,local_20);
  Boxed_Number::~Boxed_Number((Boxed_Number *)0x3b3168);
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar3;
  return (Boxed_Number)
         BVar2.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(Inner&& ... inner) const {
          return (m_func)(std::forward<Inner>(inner)...);
        }